

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O1

void __thiscall
dg::NodesSeq<dg::dda::RWNode>::NodesSeq
          (NodesSeq<dg::dda::RWNode> *this,initializer_list<dg::dda::RWNode_*> *lst)

{
  size_type sVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  (this->nodes).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->representant = (RWNode *)0x0;
  (this->nodes).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar1 = lst->_M_len;
  if (sVar1 != 0) {
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    _M_range_insert<dg::dda::RWNode*const*>
              ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)this,
               (this->nodes).
               super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish,lst->_M_array,lst->_M_array + sVar1,in_R8,in_R9,
               sVar1);
    this->representant = *lst->_M_array;
  }
  return;
}

Assistant:

NodesSeq(const std::initializer_list<NodeT *> &lst) {
        if (lst.size() > 0) {
            nodes.insert(nodes.end(), lst.begin(), lst.end());
            representant = *lst.begin();
        }
    }